

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheGL::SetUniformBuffer
          (ShaderResourceCacheGL *this,Uint32 CacheOffset,
          RefCntAutoPtr<Diligent::BufferGLImpl> *pBuff,Uint64 BaseOffset,Uint64 RangeSize)

{
  bool bVar1;
  uint uVar2;
  Char *pCVar3;
  BufferGLImpl *pBVar4;
  BufferDesc *pBVar5;
  CachedUB *this_00;
  ulong local_a8;
  undefined1 local_90 [8];
  string msg_1;
  Uint64 UBBit;
  CachedUB *UB;
  undefined1 local_50 [8];
  string msg;
  Uint64 RangeSize_local;
  Uint64 BaseOffset_local;
  RefCntAutoPtr<Diligent::BufferGLImpl> *pBuff_local;
  ShaderResourceCacheGL *pSStack_10;
  Uint32 CacheOffset_local;
  ShaderResourceCacheGL *this_local;
  
  msg.field_2._8_8_ = RangeSize;
  RangeSize_local = BaseOffset;
  BaseOffset_local = (Uint64)pBuff;
  pBuff_local._4_4_ = CacheOffset;
  pSStack_10 = this;
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)pBuff);
  if (bVar1) {
    pBVar4 = RefCntAutoPtr<Diligent::BufferGLImpl>::operator->
                       ((RefCntAutoPtr<Diligent::BufferGLImpl> *)BaseOffset_local);
    pBVar5 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                        *)pBVar4);
    local_a8 = pBVar5->Size;
  }
  else {
    local_a8 = 0;
  }
  if (local_a8 < BaseOffset + RangeSize) {
    FormatString<char[34]>((string *)local_50,(char (*) [34])"The range is out of buffer bounds");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"SetUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
               ,0x97);
    std::__cxx11::string::~string((string *)local_50);
  }
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)BaseOffset_local);
  if ((bVar1) && (msg.field_2._8_8_ == 0)) {
    pBVar4 = RefCntAutoPtr<Diligent::BufferGLImpl>::operator->
                       ((RefCntAutoPtr<Diligent::BufferGLImpl> *)BaseOffset_local);
    pBVar5 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                        *)pBVar4);
    msg.field_2._8_8_ = pBVar5->Size - RangeSize_local;
  }
  this_00 = GetUB(this,pBuff_local._4_4_);
  RefCntAutoPtr<Diligent::BufferGLImpl>::operator=
            (&this_00->pBuffer,(RefCntAutoPtr<Diligent::BufferGLImpl> *)BaseOffset_local);
  uVar2 = StaticCast<unsigned_int,unsigned_long>(&RangeSize_local);
  this_00->BaseOffset = uVar2;
  uVar2 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)(msg.field_2._M_local_buf + 8));
  this_00->RangeSize = uVar2;
  this_00->DynamicOffset = 0;
  msg_1.field_2._8_8_ = 1L << ((byte)pBuff_local._4_4_ & 0x3f);
  if ((this->m_DynamicUBOSlotMask & msg_1.field_2._8_8_) == 0) {
    if ((this->m_DynamicUBOMask & msg_1.field_2._8_8_) != 0) {
      FormatString<char[94]>
                ((string *)local_90,
                 (char (*) [94])
                 "Dynamic UBO bit should never be set when corresponding bit in m_DynamicUBOSlotMask is not set"
                );
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"SetUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
                 ,0xb1);
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  else {
    bVar1 = CachedUB::IsDynamic(this_00);
    if (bVar1) {
      this->m_DynamicUBOMask = msg_1.field_2._8_8_ | this->m_DynamicUBOMask;
    }
    else {
      this->m_DynamicUBOMask = (msg_1.field_2._8_8_ ^ 0xffffffffffffffff) & this->m_DynamicUBOMask;
    }
  }
  ShaderResourceCacheBase::UpdateRevision(&this->super_ShaderResourceCacheBase);
  return;
}

Assistant:

void SetUniformBuffer(Uint32 CacheOffset, RefCntAutoPtr<BufferGLImpl>&& pBuff, Uint64 BaseOffset, Uint64 RangeSize)
    {
        DEV_CHECK_ERR(BaseOffset + RangeSize <= (pBuff ? pBuff->GetDesc().Size : 0), "The range is out of buffer bounds");
        if (pBuff)
        {
            if (RangeSize == 0)
                RangeSize = pBuff->GetDesc().Size - BaseOffset;
        }

        auto& UB = GetUB(CacheOffset);

        UB.pBuffer       = std::move(pBuff);
        UB.BaseOffset    = StaticCast<Uint32>(BaseOffset);
        UB.RangeSize     = StaticCast<Uint32>(RangeSize);
        UB.DynamicOffset = 0;

        Uint64 UBBit = Uint64{1} << Uint64{CacheOffset};
        if (m_DynamicUBOSlotMask & UBBit)
        {
            // Only set the flag for those slots that allow dynamic buffers
            // (i.e. the variable was not created with NO_DYNAMIC_BUFFERS flag).
            if (UB.IsDynamic())
                m_DynamicUBOMask |= UBBit;
            else
                m_DynamicUBOMask &= ~UBBit;
        }
        else
        {
            VERIFY((m_DynamicUBOMask & UBBit) == 0, "Dynamic UBO bit should never be set when corresponding bit in m_DynamicUBOSlotMask is not set");
        }
        UpdateRevision();
    }